

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::upperUnscaled(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,int i)

{
  pointer pnVar1;
  int *piVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  pointer pnVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  soplex *psVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  byte bVar11;
  cpp_dec_float<200U,_int,_void> local_130;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar11 = 0;
  pnVar1 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_130,*pdVar4,(type *)0x0);
  tVar3 = boost::multiprecision::operator<
                    (pnVar1 + i,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130);
  if (tVar3) {
    pnVar1 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0x1c;
    pnVar7 = pnVar1 + i;
    psVar9 = local_b0;
    for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined4 *)psVar9 = (pnVar7->m_backend).data._M_elems[0];
      pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar11 * -2 + 1) * 4);
      psVar9 = psVar9 + (ulong)bVar11 * -8 + 4;
    }
    local_40 = pnVar1[i].m_backend.exp;
    local_3c = pnVar1[i].m_backend.neg;
    local_38._0_4_ = pnVar1[i].m_backend.fpclass;
    local_38._4_4_ = pnVar1[i].m_backend.prec_elem;
    piVar2 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).scaleExp.data;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_130,local_b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)piVar2[i],(int)piVar2);
    pcVar8 = &local_130;
    pnVar10 = __return_storage_ptr__;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar10->m_backend).data._M_elems[0] =
           (((cpp_dec_float<200U,_int,_void> *)&pcVar8->data)->data)._M_elems[0];
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar11 * -2 + 1) * 4);
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar11 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = local_130.exp;
    (__return_storage_ptr__->m_backend).neg = local_130.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_130.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_130.prec_elem;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (&__return_storage_ptr__->m_backend,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::upperUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);

   if(lp.LPColSetBase<R>::upper(i) < R(infinity))
   {
      const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
      return spxLdexp(lp.LPColSetBase<R>::upper(i), colscaleExp[i]);
   }
   else
      return lp.LPColSetBase<R>::upper(i);
}